

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O0

DataType helics::getTypeFromString(string_view typeName)

{
  bool bVar1;
  const_reference pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  pointer pvVar5;
  const_iterator dres;
  string strName;
  value_type *res;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>_>_>
  *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::DataType,_64UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_stack_ffffffffffffff60;
  string *input;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
  in_stack_ffffffffffffff80;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
  local_68;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
  local_60 [3];
  string local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  DataType local_4;
  
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
  if ((!bVar1) &&
     (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front(&local_18),
     *pvVar2 == '[')) {
    return HELICS_MULTI;
  }
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           frozen::
           unordered_map<std::basic_string_view<char,std::char_traits<char>>,helics::DataType,64ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
           ::find<std::basic_string_view<char,std::char_traits<char>>>
                     (in_stack_ffffffffffffff60,
                      (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff58)
  ;
  local_20 = pbVar3;
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           frozen::
           unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::DataType,_64UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::end((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::DataType,_64UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)0x3282c2);
  if (pbVar3 == pbVar4) {
    input = &local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88,(allocator<char> *)in_stack_ffffffffffffff80._M_cur);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    local_60[0]._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>_>_>
         ::find(in_stack_ffffffffffffff48,(key_type *)0x328329);
    local_68._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>_>_>
         ::end(in_stack_ffffffffffffff48);
    bVar1 = std::__detail::operator==(local_60,&local_68);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      gmlc::utilities::makeLowerCase(input);
      in_stack_ffffffffffffff50 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           frozen::
           unordered_map<std::basic_string_view<char,std::char_traits<char>>,helics::DataType,64ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
           ::find<std::__cxx11::string>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      local_20 = in_stack_ffffffffffffff50;
      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               frozen::
               unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::DataType,_64UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::end((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::DataType,_64UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)0x328407);
      if (in_stack_ffffffffffffff50 == pbVar3) {
        local_60[0]._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>_>_>
             ::find(in_stack_ffffffffffffff48,(key_type *)0x32844d);
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>_>_>
        ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>_>_>
               *)local_60[0]._M_cur);
        bVar1 = std::__detail::operator==
                          (local_60,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
                                     *)&stack0xffffffffffffff80);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          local_4 = HELICS_CUSTOM;
        }
        else {
          pvVar5 = std::__detail::
                   _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_false,_true>
                   ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_false,_true>
                                 *)0x328498);
          local_4 = pvVar5->second;
        }
      }
      else {
        local_4 = *(DataType *)&local_20->field_2;
      }
    }
    else {
      pvVar5 = std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_false,_true>
               ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_false,_true>
                             *)0x32836c);
      local_4 = pvVar5->second;
    }
    std::__cxx11::string::~string(in_stack_ffffffffffffff50);
  }
  else {
    local_4 = *(DataType *)&local_20->field_2;
  }
  return local_4;
}

Assistant:

DataType getTypeFromString(std::string_view typeName)
{
    if (!typeName.empty() && typeName.front() == '[') {
        return DataType::HELICS_MULTI;
    }
    const auto* res = typeMap.find(typeName);
    if (res != typeMap.end()) {
        return res->second;
    }
    std::string strName(typeName);
    auto dres = demangle_names.find(strName);
    if (dres != demangle_names.end()) {
        return dres->second;
    }
    makeLowerCase(strName);
    res = typeMap.find(strName);
    if (res != typeMap.end()) {
        return res->second;
    }
    dres = demangle_names.find(strName);
    if (dres != demangle_names.end()) {
        return dres->second;
    }
    return DataType::HELICS_CUSTOM;
}